

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::add
          (array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *this,CJoystick *item)

{
  int iVar1;
  
  incsize(this);
  iVar1 = this->num_elements;
  if (this->list_size <= iVar1) {
    alloc(this,iVar1 + 1);
  }
  this->num_elements = iVar1 + 1;
  memcpy(&this->list[iVar1].m_pInput,&item->m_pInput,0x90);
  return this->num_elements + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}